

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructColumnCheckpointState::GetStatistics(StructColumnCheckpointState *this)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  type stats;
  reference this_00;
  pointer pCVar2;
  long in_RSI;
  size_type __n;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_40;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)this;
  if (*(long *)(in_RSI + 0xa0) != *(long *)(in_RSI + 0x98)) {
    __n = 0;
    do {
      stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                           *)(in_RSI + 0x80));
      this_00 = vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_true>
                              *)(in_RSI + 0x98),__n);
      pCVar2 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
               ::operator->(this_00);
      (*pCVar2->_vptr_ColumnCheckpointState[2])(&local_40,pCVar2);
      StructStats::SetChildStats
                (stats,__n,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)&local_40);
      _Var1._M_head_impl = local_40._M_head_impl;
      if (local_40._M_head_impl != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics(local_40._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
      local_40._M_head_impl = (BaseStatistics *)0x0;
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)(in_RSI + 0xa0) - *(long *)(in_RSI + 0x98) >> 3));
  }
  *(undefined8 *)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
   super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       *(undefined8 *)(in_RSI + 0x80);
  *(undefined8 *)(in_RSI + 0x80) = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> GetStatistics() override {
		D_ASSERT(global_stats);
		for (idx_t i = 0; i < child_states.size(); i++) {
			StructStats::SetChildStats(*global_stats, i, child_states[i]->GetStatistics());
		}
		return std::move(global_stats);
	}